

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

Am_Object do_search_dir(Am_Which_Search_Direction dir,Am_Value_List *parts,
                       Am_Value_List *old_sel_list,Am_Value_List *slots_and_values_used)

{
  Am_Object *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Am_Value *pAVar10;
  Am_Wrapper *pAVar11;
  Am_Object AVar12;
  ostream *poVar13;
  int iVar14;
  undefined4 in_register_0000003c;
  Am_Value_List *in_R8;
  Am_Object object;
  Am_Object cur_target_object;
  Am_Object local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  undefined4 local_7c;
  int local_78;
  int local_74;
  Am_Value_List *local_70;
  Am_Object local_68;
  Am_Value_List *local_60;
  Am_Object *local_58;
  Am_Value_List *local_50;
  Am_Object_Data *local_48;
  Am_Value_List *local_40;
  ulong local_38;
  
  local_48 = (Am_Object_Data *)CONCAT44(in_register_0000003c,dir);
  local_98.data = (Am_Object_Data *)0x0;
  local_70 = old_sel_list;
  local_60 = slots_and_values_used;
  local_50 = parts;
  local_40 = in_R8;
  bVar2 = Am_Value_List::Valid(slots_and_values_used);
  if (bVar2) {
    Am_Value_List::Start(local_60);
    local_74 = 32000;
    local_78 = -32000;
    local_84 = 32000;
    local_88 = -32000;
    local_80 = 32000;
    local_8c = -32000;
    iVar8 = -32000;
    iVar9 = 32000;
    while (bVar2 = Am_Value_List::Last(local_60), !bVar2) {
      pAVar10 = Am_Value_List::Get(local_60);
      Am_Object::operator=(&local_98,pAVar10);
      pAVar10 = Am_Object::Get(&local_98,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar10);
      pAVar10 = Am_Object::Get(&local_98,0x65,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar10);
      pAVar10 = Am_Object::Get(&local_98,0x66,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar10);
      pAVar10 = Am_Object::Get(&local_98,0x67,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar10);
      if (local_78 < iVar3) {
        local_78 = iVar3;
      }
      if (iVar4 < local_84) {
        local_84 = iVar4;
      }
      iVar7 = iVar6 + iVar4 + -1;
      if (local_88 < iVar7) {
        local_88 = iVar7;
      }
      iVar14 = iVar5 + iVar3 + -1;
      if (iVar5 + iVar3 <= local_74) {
        local_74 = iVar14;
      }
      if (iVar3 < local_80) {
        local_80 = iVar3;
      }
      if (iVar8 < iVar4) {
        iVar8 = iVar4;
      }
      if (iVar6 + iVar4 <= iVar9) {
        iVar9 = iVar7;
      }
      if (local_8c < iVar14) {
        local_8c = iVar14;
      }
      Am_Value_List::Next(local_60);
    }
  }
  else {
    local_74 = 32000;
    local_78 = -32000;
    local_84 = -32000;
    local_88 = 32000;
    local_80 = -32000;
    local_8c = 32000;
  }
  local_68.data = (Am_Object_Data *)0x0;
  if ((int)local_50 == 8) {
    Am_Value_List::End(local_70);
    local_58 = &local_68;
    while (bVar2 = Am_Value_List::First(local_70), pAVar1 = local_58, !bVar2) {
      pAVar10 = Am_Value_List::Get(local_70);
      Am_Object::operator=(&local_98,pAVar10);
      pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
      bVar2 = Am_Value_List::Start_Member(local_60,pAVar11);
      if ((!bVar2) && (bVar2 = test_match_object(&local_98,local_40), bVar2)) {
        pAVar10 = Am_Object::Get(&local_98,100,0);
        iVar8 = Am_Value::operator_cast_to_int(pAVar10);
        pAVar10 = Am_Object::Get(&local_98,0x65,0);
        iVar9 = Am_Value::operator_cast_to_int(pAVar10);
        pAVar10 = Am_Object::Get(&local_98,0x66,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar10);
        pAVar10 = Am_Object::Get(&local_98,0x67,0);
        iVar4 = Am_Value::operator_cast_to_int(pAVar10);
        if ((iVar8 <= local_80) &&
           (((iVar9 <= local_84 && (local_88 < iVar4 + iVar9)) &&
            (pAVar1 = &local_98, local_8c < iVar3 + iVar8)))) break;
      }
      Am_Value_List::Prev(local_70);
    }
  }
  else {
    Am_Value_List::Start(local_70);
    local_7c = 32000;
    local_58 = &local_68;
    local_38 = (ulong)((int)local_50 - 3);
    while (bVar2 = Am_Value_List::Last(local_70), pAVar1 = local_58, !bVar2) {
      pAVar10 = Am_Value_List::Get(local_70);
      Am_Object::operator=(&local_98,pAVar10);
      pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
      bVar2 = Am_Value_List::Start_Member(local_60,pAVar11);
      if ((!bVar2) && (bVar2 = test_match_object(&local_98,local_40), bVar2)) {
        pAVar10 = Am_Object::Get(&local_98,100,0);
        iVar8 = Am_Value::operator_cast_to_int(pAVar10);
        pAVar10 = Am_Object::Get(&local_98,0x65,0);
        Am_Value::operator_cast_to_int(pAVar10);
        pAVar10 = Am_Object::Get(&local_98,0x66,0);
        iVar9 = Am_Value::operator_cast_to_int(pAVar10);
        pAVar10 = Am_Object::Get(&local_98,0x67,0);
        Am_Value::operator_cast_to_int(pAVar10);
        if (4 < (uint)local_38) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Bad dir ",8);
          poVar13 = (ostream *)std::ostream::operator<<(&std::cerr,(int)local_50);
          std::endl<char,std::char_traits<char>>(poVar13);
          Am_Error();
        }
        AVar12.data = (Am_Object_Data *)
                      (*(code *)(&DAT_0028a0e0 + *(int *)(&DAT_0028a0e0 + local_38 * 4)))
                                (iVar8,&DAT_0028a0e0,local_38,
                                 &DAT_0028a0e0 + *(int *)(&DAT_0028a0e0 + local_38 * 4),
                                 iVar9 + iVar8 + -1);
        return (Am_Object)AVar12.data;
      }
      Am_Value_List::Next(local_70);
    }
  }
  local_58 = pAVar1;
  Am_Object::Am_Object((Am_Object *)local_48,local_58);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_98);
  return (Am_Object)local_48;
}

Assistant:

Am_Object
do_search_dir(Am_Which_Search_Direction dir, Am_Value_List &parts,
              Am_Value_List &old_sel_list, Am_Value_List &slots_and_values_used)
{

  //compute the starting positions
  int max_l = -32000;
  int min_r = 32000;
  int min_t = 32000;
  int max_b = -32000;

  int min_l = 32000;
  int max_r = -32000;
  int max_t = -32000;
  int min_b = 32000;
  int this_l, this_t, this_b, this_r;
  Am_Object object;
  if (old_sel_list.Valid()) {
    for (old_sel_list.Start(); !old_sel_list.Last(); old_sel_list.Next()) {
      object = old_sel_list.Get();
      this_l = object.Get(Am_LEFT);
      this_t = object.Get(Am_TOP);
      this_r = this_l + (int)object.Get(Am_WIDTH) - 1;
      this_b = this_t + (int)object.Get(Am_HEIGHT) - 1;
      if (this_l > max_l)
        max_l = this_l;
      if (this_t < min_t)
        min_t = this_t;
      if (this_b > max_b)
        max_b = this_b;
      if (this_r < min_r)
        min_r = this_r;
      if (this_l < min_l)
        min_l = this_l;
      if (this_t > max_t)
        max_t = this_t;
      if (this_b < min_b)
        min_b = this_b;
      if (this_r > max_r)
        max_r = this_r;
    }
  } else { //if no objects, set edge values
    min_l = -32000;
    max_l = -32000;
    max_t = -32000;
    min_t = -32000;
    min_r = 32000;
    max_r = 32000;
    min_b = 32000;
    max_b = 32000;
  }
  //now search forward for new object
  int target_min_amount = 32000;
  int target_max_amount = 0;
  Am_Object cur_target_object;

  if (dir == Am_Search_Out) { //have to go in opposite order
    for (parts.End(); !parts.First(); parts.Prev()) {
      object = parts.Get();
      if (!old_sel_list.Start_Member(object) &&
          test_match_object(object, slots_and_values_used)) {
        this_l = object.Get(Am_LEFT);
        this_t = object.Get(Am_TOP);
        this_r = this_l + (int)object.Get(Am_WIDTH) - 1;
        this_b = this_t + (int)object.Get(Am_HEIGHT) - 1;
        if (this_l <= min_l && this_t <= min_t && this_b >= max_b &&
            this_r >= max_r) {
          return object;
        }
      }
    }
  } else {
    for (parts.Start(); !parts.Last(); parts.Next()) {
      object = parts.Get();
      if (!old_sel_list.Start_Member(object) &&
          test_match_object(object, slots_and_values_used)) {
        this_l = object.Get(Am_LEFT);
        this_t = object.Get(Am_TOP);
        this_r = this_l + (int)object.Get(Am_WIDTH) - 1;
        this_b = this_t + (int)object.Get(Am_HEIGHT) - 1;
        switch (dir) {
        case Am_Search_Up:
          if (this_b <= min_b && this_b > target_max_amount &&
              this_r >= min_l && this_l <= max_r) {
            target_max_amount = this_b;
            cur_target_object = object;
          }
          break;
        case Am_Search_Down:
          if (this_t >= max_t && this_t < target_min_amount &&
              this_r >= min_l && this_l <= max_r) {
            target_min_amount = this_t;
            cur_target_object = object;
          }
          break;
        case Am_Search_Left:
          if (this_r <= min_r && this_r > target_max_amount &&
              this_b >= min_t && this_t <= max_b) {
            target_max_amount = this_r;
            cur_target_object = object;
          }
          break;
        case Am_Search_Right:
          if (this_l >= max_l && this_l < target_min_amount &&
              this_b >= min_t && this_t <= max_b) {
            target_min_amount = this_l;
            cur_target_object = object;
          }
          break;
        case Am_Search_In:
          if (this_l >= min_l && this_t >= min_t && this_b <= max_b &&
              this_r <= max_r) {
            return object;
          }
          break;
        default:
          Am_ERROR("Bad dir " << (int)dir);
        }
      }
    }
  }
  return cur_target_object;
}